

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

bool __thiscall
ON_SerialNumberMap::IsValid(ON_SerialNumberMap *this,bool bBuildHashTable,ON_TextLog *textlog)

{
  uint uVar1;
  ON_SN_BLOCK *pOVar2;
  bool bVar3;
  bool bVar4;
  ON_SN_BLOCK **ppOVar5;
  ON__UINT32 OVar6;
  SN_ELEMENT ***pppSVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  SN_ELEMENT *pSVar12;
  ulong uVar13;
  ulong uVar14;
  ON__UINT64 aic;
  SN_ELEMENT ****local_48;
  ON__UINT32 *local_40;
  ON__UINT64 local_38;
  
  local_38 = 0;
  if (this->m_active_id_count == 0 || bBuildHashTable) {
    if (this->m_active_id_count != 0) {
      if ((this->m_bHashTableIsValid == '\0') &&
         (((Internal_HashTableBuild(this), this->m_bHashTableIsValid == '\0' ||
           (this->m_hash_table_blocks == (SN_ELEMENT ***)0x0)) || (this->m_hash_block_count == 0))))
      {
        if (textlog != (ON_TextLog *)0x0) {
          ON_TextLog::Print(textlog,"Unable to build hash table.\n");
        }
        bVar3 = ON_IsNotValid();
        return bVar3;
      }
      goto LAB_004d0265;
    }
LAB_004d0283:
    pppSVar7 = (SN_ELEMENT ***)0x0;
    bVar3 = false;
    OVar6 = 0;
  }
  else {
    if (this->m_bHashTableIsValid == '\0') goto LAB_004d0283;
LAB_004d0265:
    pppSVar7 = this->m_hash_table_blocks;
    OVar6 = this->m_hash_block_count;
    bVar3 = true;
  }
  local_40 = &this->m_hash_block_count;
  local_48 = &this->m_hash_table_blocks;
  bVar4 = ON_SN_BLOCK::IsValidBlock(this->m_sn_block0,textlog,pppSVar7,OVar6,&local_38);
  if (bVar4) {
    uVar14 = (ulong)this->m_sn_block0->m_count;
    uVar9 = (ulong)this->m_sn_block0->m_purged;
    if (this->m_snblk_list_count != 0) {
      ppOVar5 = this->m_snblk_list;
      uVar11 = 0;
      do {
        pOVar2 = ppOVar5[uVar11];
        if (pOVar2->m_count == 0) {
          if (textlog != (ON_TextLog *)0x0) {
            pcVar8 = "m_snblk_list[%d] is empty\n";
LAB_004d03f8:
            ON_TextLog::Print(textlog,pcVar8,uVar11);
          }
          goto LAB_004d044c;
        }
        if (pOVar2->m_sorted != 1) {
          if (textlog != (ON_TextLog *)0x0) {
            pcVar8 = "m_snblk_list[%d] is not sorted\n";
            goto LAB_004d03f8;
          }
          goto LAB_004d044c;
        }
        if (bVar3) {
          pppSVar7 = *local_48;
          OVar6 = *local_40;
        }
        else {
          pppSVar7 = (SN_ELEMENT ***)0x0;
          OVar6 = 0;
        }
        bVar4 = ON_SN_BLOCK::IsValidBlock(pOVar2,textlog,pppSVar7,OVar6,&local_38);
        if (!bVar4) {
          if (textlog != (ON_TextLog *)0x0) {
            pcVar8 = "m_snblk_list[%d] is not valid\n";
            goto LAB_004d03f8;
          }
          goto LAB_004d044c;
        }
        ppOVar5 = this->m_snblk_list;
        pOVar2 = ppOVar5[uVar11];
        if ((uVar11 != 0) && (pOVar2->m_sn0 <= ppOVar5[uVar11 - 1]->m_sn1)) {
          if (textlog == (ON_TextLog *)0x0) goto LAB_004d044c;
          uVar14 = uVar11 - 1;
          pcVar8 = "m_snblk_list[%d]->m_sn0 <= m_snblk_list[%d]->m_sn1\n";
          goto LAB_004d0445;
        }
        uVar14 = uVar14 + pOVar2->m_count;
        uVar9 = uVar9 + pOVar2->m_purged;
        uVar11 = uVar11 + 1;
      } while (uVar11 < this->m_snblk_list_count);
    }
    uVar11 = this->m_sn_count;
    if (uVar14 == uVar11) {
      uVar11 = this->m_sn_purged;
      if (uVar9 == uVar11) {
        uVar11 = this->m_active_id_count;
        if (uVar11 == local_38) {
          if (uVar11 + uVar9 <= uVar14) {
            if (!bVar3) {
              return true;
            }
            uVar14 = (ulong)*local_40;
            if (uVar14 == 0) {
              return true;
            }
            uVar9 = 0;
            uVar13 = 0;
            do {
              uVar10 = 0;
              do {
                pSVar12 = (*local_48)[uVar9][uVar10];
                for (; (pSVar12 != (SN_ELEMENT *)0x0 && (uVar13 <= uVar11)); uVar13 = uVar13 + 1) {
                  uVar1 = pSVar12->m_id_crc32;
                  if ((uVar9 != (ulong)uVar1 % uVar14) ||
                     (uVar10 != uVar1 / 0xffa + (uVar1 / 0xff4024) * -0xffa)) {
                    if (textlog == (ON_TextLog *)0x0) goto LAB_004d044c;
                    pcVar8 = "m_hash_table linked lists are corrupt.\n";
                    goto LAB_004d03a9;
                  }
                  pSVar12 = pSVar12->m_next;
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != 0xffa);
              uVar9 = uVar9 + 1;
            } while (uVar9 < uVar14);
            if (uVar13 <= uVar11) {
              return true;
            }
            if (textlog == (ON_TextLog *)0x0) goto LAB_004d044c;
            pcVar8 = "m_hash_table[] linked lists have too many elements.\n";
            goto LAB_004d03a9;
          }
          if (textlog == (ON_TextLog *)0x0) goto LAB_004d044c;
          uVar14 = uVar14 - uVar9;
          pcVar8 = "m_active_id_count=%d > %d = (m_sn_count-m_sn_purged)\n";
        }
        else {
          if (textlog == (ON_TextLog *)0x0) goto LAB_004d044c;
          pcVar8 = "m_active_id_count=%d (should be %d) is not correct\n";
          uVar14 = local_38;
        }
      }
      else {
        if (textlog == (ON_TextLog *)0x0) goto LAB_004d044c;
        pcVar8 = "m_sn_purged=%d (should be %d) is not correct\n";
        uVar14 = uVar9;
      }
    }
    else {
      if (textlog == (ON_TextLog *)0x0) goto LAB_004d044c;
      pcVar8 = "m_sn_count=%d (should be %d) is not correct\n";
    }
LAB_004d0445:
    ON_TextLog::Print(textlog,pcVar8,uVar11,uVar14);
  }
  else {
    if (textlog == (ON_TextLog *)0x0) goto LAB_004d044c;
    pcVar8 = "m_sn_block0 is not valid\n";
LAB_004d03a9:
    ON_TextLog::Print(textlog,pcVar8);
  }
LAB_004d044c:
  bVar3 = ON_IsNotValid();
  return bVar3;
}

Assistant:

bool ON_SerialNumberMap::IsValid(
   bool bBuildHashTable,
   ON_TextLog* textlog
   ) const
{
  ON__UINT64 i, c, pc, aic;

  aic = 0;

  const bool bTestHashTable = (m_active_id_count > 0 && (bBuildHashTable || m_bHashTableIsValid));
  if (bTestHashTable && false == m_bHashTableIsValid)
  {
    const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableBuild();
    if (false == m_bHashTableIsValid || nullptr == m_hash_table_blocks || m_hash_block_count <= 0)
    {
      if ( textlog )
        textlog->Print("Unable to build hash table.\n");
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  if ( !m_sn_block0.IsValidBlock(
    textlog,
    bTestHashTable ? m_hash_table_blocks : nullptr,
    bTestHashTable ? m_hash_block_count : 0,
    &aic) 
    )
  {
    if ( textlog )
      textlog->Print("m_sn_block0 is not valid\n");
    return ON_SerialNumberMap_IsNotValid();
  }

  c = m_sn_block0.m_count;
  pc = m_sn_block0.m_purged;

  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    if ( 0 == m_snblk_list[i]->m_count )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is empty\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    if ( 1 != m_snblk_list[i]->m_sorted )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is not sorted\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    if ( !m_snblk_list[i]->IsValidBlock(
      textlog,
      bTestHashTable ? m_hash_table_blocks : nullptr,
      bTestHashTable ? m_hash_block_count : 0,
      &aic) 
      )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is not valid\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    c += m_snblk_list[i]->m_count;
    pc += m_snblk_list[i]->m_purged;
    if ( i>0 && m_snblk_list[i]->m_sn0 <= m_snblk_list[i-1]->m_sn1 )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d]->m_sn0 <= m_snblk_list[%d]->m_sn1\n",i,i-1);
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  if ( c != m_sn_count )
  {
    if ( textlog )
      textlog->Print("m_sn_count=%d (should be %d) is not correct\n",m_sn_count,c);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( pc != m_sn_purged )
  {
    if ( textlog )
      textlog->Print("m_sn_purged=%d (should be %d) is not correct\n",m_sn_purged,pc);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( m_active_id_count != aic )
  {
    if ( textlog )
      textlog->Print("m_active_id_count=%d (should be %d) is not correct\n",m_active_id_count,aic);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( m_active_id_count + m_sn_purged > m_sn_count )
  {
    if ( textlog )
      textlog->Print("m_active_id_count=%d > %d = (m_sn_count-m_sn_purged)\n",m_active_id_count,m_sn_count-m_sn_purged);
    return ON_SerialNumberMap_IsNotValid();
  }

  if (bTestHashTable)
  {
    c = 0;
    for (ON__UINT32 hash_block_index = 0; hash_block_index < m_hash_block_count; hash_block_index++)
    {
      const SN_ELEMENT*const* hash_table_block = m_hash_table_blocks[hash_block_index];
      for (ON__UINT32 hash_i = 0; hash_i < ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY; hash_i++)
      {
        for (const SN_ELEMENT* e = hash_table_block[hash_i]; nullptr != e && c <= m_active_id_count; e = e->m_next)
        {
          if (
            hash_block_index != Internal_HashTableBlockIndex(e->m_id_crc32)
            || hash_i != ON_SerialNumberMap::Internal_HashTableBlockRowIndex(e->m_id_crc32)
            )
          {
            if (textlog)
              textlog->Print("m_hash_table linked lists are corrupt.\n");
            return ON_SerialNumberMap_IsNotValid();
          }
          c++;
        }
      }
    }

    if (c > m_active_id_count)
    {
      if (textlog)
        textlog->Print("m_hash_table[] linked lists have too many elements.\n");
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  return true;
}